

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::SliderBehaviorT<int,int,float>
               (ImRect *bb,ImGuiID id,ImGuiDataType data_type,int *v,int v_min,int v_max,
               char *format,float power,ImGuiSliderFlags flags)

{
  ImDrawList *this;
  bool bVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  ImU32 IVar4;
  int iVar5;
  int iVar6;
  ImGuiWindow *pIVar7;
  ImGuiCol idx;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  float fVar11;
  float a_00;
  float fVar12;
  float fVar13;
  ImVec2 IVar14;
  float local_120;
  float local_11c;
  float local_118;
  float local_114;
  float local_110;
  float local_10c;
  float local_108;
  int local_104;
  float local_100;
  bool local_f9;
  ImGuiCol local_f8;
  ImRect local_f4;
  ImRect local_e4;
  undefined1 local_d4 [8];
  ImRect grab_bb;
  float grab_pos;
  float grab_t;
  int v_new_off_round;
  int v_new_off_floor;
  float v_new_off_f;
  float a_1;
  float a;
  int v_new;
  float delta;
  ImVec2 delta2;
  float mouse_abs_pos;
  float clicked_t;
  bool set_new_value;
  bool value_changed;
  float linear_dist_max_to_0;
  float linear_dist_min_to_0;
  float linear_zero_pos;
  float slider_usable_pos_max;
  float slider_usable_pos_min;
  float slider_usable_sz;
  int v_range;
  float grab_sz;
  float slider_sz;
  float grab_padding;
  bool is_power;
  bool is_decimal;
  bool is_horizontal;
  ImU32 frame_col;
  ImGuiStyle *style;
  ImGuiWindow *window;
  ImGuiContext *g;
  float power_local;
  int v_max_local;
  int v_min_local;
  int *v_local;
  ImGuiDataType data_type_local;
  ImGuiID id_local;
  ImRect *bb_local;
  
  pIVar2 = GImGui;
  pIVar7 = GetCurrentWindow();
  if (pIVar2->ActiveId == id) {
    local_f8 = 9;
  }
  else {
    local_f8 = 7;
    if (pIVar2->HoveredId == id) {
      local_f8 = 8;
    }
  }
  IVar4 = GetColorU32(local_f8,1.0);
  RenderNavHighlight(bb,id,1);
  RenderFrame(bb->Min,bb->Max,IVar4,true,(pIVar2->Style).FrameRounding);
  bVar8 = (flags & 1U) != 0;
  bVar9 = data_type == 4;
  bVar10 = data_type == 5;
  local_f9 = bVar9 || bVar10;
  bVar1 = local_f9;
  if ((power == 1.0) && (!NAN(power))) {
    bVar1 = false;
  }
  if (bVar8) {
    local_100 = ImRect::GetHeight(bb);
  }
  else {
    local_100 = ImRect::GetWidth(bb);
  }
  local_100 = local_100 - 4.0;
  slider_usable_sz = (pIVar2->Style).GrabMinSize;
  if (v_min < v_max) {
    local_104 = v_max - v_min;
  }
  else {
    local_104 = v_min - v_max;
  }
  if ((!bVar9 && !bVar10) && (-1 < local_104)) {
    slider_usable_sz = ImMax<float>(local_100 / (float)(local_104 + 1),(pIVar2->Style).GrabMinSize);
  }
  fVar11 = ImMin<float>(slider_usable_sz,local_100);
  if (bVar8) {
    local_108 = (bb->Min).y;
  }
  else {
    local_108 = (bb->Min).x;
  }
  a_00 = fVar11 * 0.5 + local_108 + 2.0;
  if (bVar8) {
    local_10c = (bb->Max).y;
  }
  else {
    local_10c = (bb->Max).x;
  }
  if ((!bVar1) || (0.0 <= (float)(v_min * v_max))) {
    linear_dist_max_to_0 = (float)(-(uint)((float)v_min < 0.0) & 0x3f800000);
  }
  else {
    if (v_min < 0) {
      local_110 = -(float)v_min;
    }
    else {
      local_110 = (float)v_min;
    }
    fVar12 = ImPow(local_110,1.0 / power);
    if (v_max < 0) {
      local_114 = -(float)v_max;
    }
    else {
      local_114 = (float)v_max;
    }
    fVar13 = ImPow(local_114,1.0 / power);
    linear_dist_max_to_0 = fVar12 / (fVar12 + fVar13);
  }
  mouse_abs_pos._3_1_ = false;
  if (pIVar2->ActiveId == id) {
    bVar3 = false;
    delta2.y = 0.0;
    if (pIVar2->ActiveIdSource == ImGuiInputSource_Mouse) {
      if (((pIVar2->IO).MouseDown[0] & 1U) == 0) {
        ClearActiveID();
      }
      else {
        if (bVar8) {
          local_118 = (pIVar2->IO).MousePos.y;
        }
        else {
          local_118 = (pIVar2->IO).MousePos.x;
        }
        if (local_100 - fVar11 <= 0.0) {
          local_11c = 0.0;
        }
        else {
          local_11c = ImClamp<float>((local_118 - a_00) / (local_100 - fVar11),0.0,1.0);
        }
        delta2.y = local_11c;
        if (bVar8) {
          delta2.y = 1.0 - local_11c;
        }
        bVar3 = true;
      }
    }
    else if (pIVar2->ActiveIdSource == ImGuiInputSource_Nav) {
      IVar14 = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.0,0.0);
      if (bVar8) {
        delta = IVar14.y;
        local_120 = -delta;
      }
      else {
        v_new = (int)IVar14.x;
        local_120 = (float)v_new;
      }
      if ((pIVar2->NavActivatePressedId == id) && ((pIVar2->ActiveIdIsJustActivated & 1U) == 0)) {
        ClearActiveID();
      }
      else if ((local_120 != 0.0) || (NAN(local_120))) {
        delta2.y = SliderBehaviorCalcRatioFromValue<int,float>
                             (data_type,*v,v_min,v_max,power,linear_dist_max_to_0);
        if ((local_f9) || (bVar1)) {
          a = local_120 / 100.0;
          bVar3 = IsNavInputDown(0xe);
          if (bVar3) {
            a = a / 10.0;
          }
        }
        else if (((-100.0 <= (float)local_104) && ((float)local_104 <= 100.0)) ||
                (bVar3 = IsNavInputDown(0xe), bVar3)) {
          a = (float)(~-(uint)(local_120 < 0.0) & 0x3f800000 | -(uint)(local_120 < 0.0) & 0xbf800000
                     ) / (float)local_104;
        }
        else {
          a = local_120 / 100.0;
        }
        bVar3 = IsNavInputDown(0xf);
        if (bVar3) {
          a = a * 10.0;
        }
        bVar3 = true;
        if (((1.0 <= delta2.y) && (0.0 < a)) || ((delta2.y <= 0.0 && (a < 0.0)))) {
          bVar3 = false;
        }
        else {
          delta2.y = ImSaturate(delta2.y + a);
        }
      }
    }
    if (bVar3) {
      if (bVar1) {
        if (linear_dist_max_to_0 <= delta2.y) {
          fVar12 = ImFabs(linear_dist_max_to_0 - 1.0);
          if (fVar12 <= 1e-06) {
            v_new_off_floor = (int)delta2.y;
          }
          else {
            v_new_off_floor =
                 (int)((delta2.y - linear_dist_max_to_0) / (1.0 - linear_dist_max_to_0));
          }
          fVar12 = ImPow((float)v_new_off_floor,power);
          iVar5 = ImMax<int>(v_min,0);
          a_1 = (float)ImLerp<int>(iVar5,v_max,fVar12);
        }
        else {
          fVar12 = ImPow(1.0 - delta2.y / linear_dist_max_to_0,power);
          iVar5 = ImMin<int>(v_max,0);
          a_1 = (float)ImLerp<int>(iVar5,v_min,fVar12);
        }
      }
      else if (bVar9 || bVar10) {
        a_1 = (float)ImLerp<int>(v_min,v_max,delta2.y);
      }
      else {
        fVar12 = (float)(v_max - v_min) * delta2.y;
        iVar5 = (int)fVar12;
        iVar6 = (int)(fVar12 + 0.5);
        if ((!bVar9 && !bVar10) && (iVar5 < iVar6)) {
          iVar5 = iVar6;
        }
        a_1 = (float)(v_min + iVar5);
      }
      iVar5 = RoundScalarWithFormat<int,int>(format,data_type,(int)a_1);
      mouse_abs_pos._3_1_ = *v != iVar5;
      if (mouse_abs_pos._3_1_) {
        *v = iVar5;
      }
    }
  }
  grab_bb.Max.y =
       SliderBehaviorCalcRatioFromValue<int,float>
                 (data_type,*v,v_min,v_max,power,linear_dist_max_to_0);
  if (bVar8) {
    grab_bb.Max.y = 1.0 - grab_bb.Max.y;
  }
  grab_bb.Max.x = ImLerp<float>(a_00,-fVar11 * 0.5 + (local_10c - 2.0),grab_bb.Max.y);
  ImRect::ImRect((ImRect *)local_d4);
  if (bVar8) {
    ImRect::ImRect(&local_f4,(bb->Min).x + 2.0,-fVar11 * 0.5 + grab_bb.Max.x,(bb->Max).x - 2.0,
                   fVar11 * 0.5 + grab_bb.Max.x);
    local_d4._0_4_ = local_f4.Min.x;
    local_d4._4_4_ = local_f4.Min.y;
    grab_bb.Min = local_f4.Max;
  }
  else {
    ImRect::ImRect(&local_e4,-fVar11 * 0.5 + grab_bb.Max.x,(bb->Min).y + 2.0,
                   fVar11 * 0.5 + grab_bb.Max.x,(bb->Max).y - 2.0);
    local_d4._0_4_ = local_e4.Min.x;
    local_d4._4_4_ = local_e4.Min.y;
    grab_bb.Min = local_e4.Max;
  }
  this = pIVar7->DrawList;
  idx = 0x13;
  if (pIVar2->ActiveId == id) {
    idx = 0x14;
  }
  IVar4 = GetColorU32(idx,1.0);
  ImDrawList::AddRectFilled
            (this,(ImVec2 *)local_d4,&grab_bb.Min,IVar4,(pIVar2->Style).GrabRounding,0xf);
  return mouse_abs_pos._3_1_;
}

Assistant:

static bool ImGui::SliderBehaviorT(const ImRect& bb, ImGuiID id, ImGuiDataType data_type, TYPE* v, const TYPE v_min, const TYPE v_max, const char* format, float power, ImGuiSliderFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    const ImGuiStyle& style = g.Style;

    // Draw frame
    const ImU32 frame_col = GetColorU32(g.ActiveId == id ? ImGuiCol_FrameBgActive : g.HoveredId == id ? ImGuiCol_FrameBgHovered : ImGuiCol_FrameBg);
    RenderNavHighlight(bb, id);
    RenderFrame(bb.Min, bb.Max, frame_col, true, style.FrameRounding);

    const bool is_horizontal = (flags & ImGuiSliderFlags_Vertical) == 0;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const bool is_power = (power != 1.0f) && is_decimal;

    const float grab_padding = 2.0f;
    const float slider_sz = is_horizontal ? (bb.GetWidth() - grab_padding * 2.0f) : (bb.GetHeight() - grab_padding * 2.0f);
    float grab_sz = style.GrabMinSize;
    SIGNEDTYPE v_range = (v_min < v_max ? v_max - v_min : v_min - v_max);
    if (!is_decimal && v_range >= 0)                                             // v_range < 0 may happen on integer overflows
        grab_sz = ImMax((float)(slider_sz / (v_range + 1)), style.GrabMinSize);  // For integer sliders: if possible have the grab size represent 1 unit
    grab_sz = ImMin(grab_sz, slider_sz);
    const float slider_usable_sz = slider_sz - grab_sz;
    const float slider_usable_pos_min = (is_horizontal ? bb.Min.x : bb.Min.y) + grab_padding + grab_sz*0.5f;
    const float slider_usable_pos_max = (is_horizontal ? bb.Max.x : bb.Max.y) - grab_padding - grab_sz*0.5f;

    // For power curve sliders that cross over sign boundary we want the curve to be symmetric around 0.0f
    float linear_zero_pos;   // 0.0->1.0f
    if (is_power && v_min * v_max < 0.0f)
    {
        // Different sign
        const FLOATTYPE linear_dist_min_to_0 = ImPow(v_min >= 0 ? (FLOATTYPE)v_min : -(FLOATTYPE)v_min, (FLOATTYPE)1.0f/power);
        const FLOATTYPE linear_dist_max_to_0 = ImPow(v_max >= 0 ? (FLOATTYPE)v_max : -(FLOATTYPE)v_max, (FLOATTYPE)1.0f/power);
        linear_zero_pos = (float)(linear_dist_min_to_0 / (linear_dist_min_to_0 + linear_dist_max_to_0));
    }
    else
    {
        // Same sign
        linear_zero_pos = v_min < 0.0f ? 1.0f : 0.0f;
    }

    // Process interacting with the slider
    bool value_changed = false;
    if (g.ActiveId == id)
    {
        bool set_new_value = false;
        float clicked_t = 0.0f;
        if (g.ActiveIdSource == ImGuiInputSource_Mouse)
        {
            if (!g.IO.MouseDown[0])
            {
                ClearActiveID();
            }
            else
            {
                const float mouse_abs_pos = is_horizontal ? g.IO.MousePos.x : g.IO.MousePos.y;
                clicked_t = (slider_usable_sz > 0.0f) ? ImClamp((mouse_abs_pos - slider_usable_pos_min) / slider_usable_sz, 0.0f, 1.0f) : 0.0f;
                if (!is_horizontal)
                    clicked_t = 1.0f - clicked_t;
                set_new_value = true;
            }
        }
        else if (g.ActiveIdSource == ImGuiInputSource_Nav)
        {
            const ImVec2 delta2 = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 0.0f, 0.0f);
            float delta = is_horizontal ? delta2.x : -delta2.y;
            if (g.NavActivatePressedId == id && !g.ActiveIdIsJustActivated)
            {
                ClearActiveID();
            }
            else if (delta != 0.0f)
            {
                clicked_t = SliderBehaviorCalcRatioFromValue<TYPE,FLOATTYPE>(data_type, *v, v_min, v_max, power, linear_zero_pos);
                if (is_decimal || is_power)
                {
                    delta /= 100.0f;    // Gamepad/keyboard tweak speeds in % of slider bounds
                    if (IsNavInputDown(ImGuiNavInput_TweakSlow))
                        delta /= 10.0f;
                }
                else
                {
                    if ((v_range >= -100.0f && v_range <= 100.0f) || IsNavInputDown(ImGuiNavInput_TweakSlow))
                        delta = ((delta < 0.0f) ? -1.0f : +1.0f) / (float)v_range; // Gamepad/keyboard tweak speeds in integer steps
                    else
                        delta /= 100.0f;
                }
                if (IsNavInputDown(ImGuiNavInput_TweakFast))
                    delta *= 10.0f;
                set_new_value = true;
                if ((clicked_t >= 1.0f && delta > 0.0f) || (clicked_t <= 0.0f && delta < 0.0f)) // This is to avoid applying the saturation when already past the limits
                    set_new_value = false;
                else
                    clicked_t = ImSaturate(clicked_t + delta);
            }
        }

        if (set_new_value)
        {
            TYPE v_new;
            if (is_power)
            {
                // Account for power curve scale on both sides of the zero
                if (clicked_t < linear_zero_pos)
                {
                    // Negative: rescale to the negative range before powering
                    float a = 1.0f - (clicked_t / linear_zero_pos);
                    a = ImPow(a, power);
                    v_new = ImLerp(ImMin(v_max, (TYPE)0), v_min, a);
                }
                else
                {
                    // Positive: rescale to the positive range before powering
                    float a;
                    if (ImFabs(linear_zero_pos - 1.0f) > 1.e-6f)
                        a = (clicked_t - linear_zero_pos) / (1.0f - linear_zero_pos);
                    else
                        a = clicked_t;
                    a = ImPow(a, power);
                    v_new = ImLerp(ImMax(v_min, (TYPE)0), v_max, a);
                }
            }
            else
            {
                // Linear slider
                if (is_decimal)
                {
                    v_new = ImLerp(v_min, v_max, clicked_t);
                }
                else
                {
                    // For integer values we want the clicking position to match the grab box so we round above
                    // This code is carefully tuned to work with large values (e.g. high ranges of U64) while preserving this property..
                    FLOATTYPE v_new_off_f = (v_max - v_min) * clicked_t;
                    TYPE v_new_off_floor = (TYPE)(v_new_off_f);
                    TYPE v_new_off_round = (TYPE)(v_new_off_f + (FLOATTYPE)0.5);
                    if (!is_decimal && v_new_off_floor < v_new_off_round)
                        v_new = v_min + v_new_off_round;
                    else
                        v_new = v_min + v_new_off_floor;
                }
            }

            // Round to user desired precision based on format string
            v_new = RoundScalarWithFormat<TYPE,SIGNEDTYPE>(format, data_type, v_new);

            // Apply result
            if (*v != v_new)
            {
                *v = v_new;
                value_changed = true;
            }
        }
    }

    // Draw
    float grab_t = SliderBehaviorCalcRatioFromValue<TYPE,FLOATTYPE>(data_type, *v, v_min, v_max, power, linear_zero_pos);
    if (!is_horizontal)
        grab_t = 1.0f - grab_t;
    const float grab_pos = ImLerp(slider_usable_pos_min, slider_usable_pos_max, grab_t);
    ImRect grab_bb;
    if (is_horizontal)
        grab_bb = ImRect(grab_pos - grab_sz*0.5f, bb.Min.y + grab_padding, grab_pos + grab_sz*0.5f, bb.Max.y - grab_padding);
    else
        grab_bb = ImRect(bb.Min.x + grab_padding, grab_pos - grab_sz*0.5f, bb.Max.x - grab_padding, grab_pos + grab_sz*0.5f);
    window->DrawList->AddRectFilled(grab_bb.Min, grab_bb.Max, GetColorU32(g.ActiveId == id ? ImGuiCol_SliderGrabActive : ImGuiCol_SliderGrab), style.GrabRounding);

    return value_changed;
}